

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::loadNode(CoronaLoader *this,Ref<embree::XML> *xml)

{
  int iVar1;
  runtime_error *this_00;
  long *plVar2;
  size_type *psVar3;
  Ref<embree::XML> *in_RDX;
  char *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  iVar1 = std::__cxx11::string::compare((char *)&in_RDX->ptr->name);
  if (iVar1 != 0) {
    this_01 = "mtllib";
    iVar1 = std::__cxx11::string::compare((char *)&in_RDX->ptr->name);
    if (iVar1 == 0) {
      load<embree::FileName>((FileName *)&local_88,(CoronaLoader *)this_01,in_RDX);
      loadMaterialLibrary(this,(FileName *)xml);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == &local_88.field_2) {
        return (Ref<embree::SceneGraph::Node>)(Node *)this;
      }
      operator_delete(local_88._M_dataplus._M_p);
      return (Ref<embree::SceneGraph::Node>)(Node *)this;
    }
    iVar1 = std::__cxx11::string::compare((char *)&in_RDX->ptr->name);
    if ((iVar1 != 0) &&
       (iVar1 = std::__cxx11::string::compare((char *)&in_RDX->ptr->name), iVar1 != 0)) {
      iVar1 = std::__cxx11::string::compare((char *)&in_RDX->ptr->name);
      if (iVar1 == 0) {
        loadGroupNode(this,xml);
        return (Ref<embree::SceneGraph::Node>)(Node *)this;
      }
      iVar1 = std::__cxx11::string::compare((char *)&in_RDX->ptr->name);
      if (iVar1 != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_(&local_48,&in_RDX->ptr->loc);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
        local_68._M_dataplus._M_p = (pointer)*plVar2;
        psVar3 = (size_type *)(plVar2 + 2);
        if ((size_type *)local_68._M_dataplus._M_p == psVar3) {
          local_68.field_2._M_allocated_capacity = *psVar3;
          local_68.field_2._8_8_ = plVar2[3];
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar3;
        }
        local_68._M_string_length = plVar2[1];
        *plVar2 = (long)psVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::operator+(&local_88,&local_68,&in_RDX->ptr->name);
        std::runtime_error::runtime_error(this_00,(string *)&local_88);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::loadNode(const Ref<XML>& xml)
  {
    if      (xml->name == "conffile"     ) return nullptr;
    else if (xml->name == "mtllib"       ) return loadMaterialLibrary(load<FileName>(xml));
    else if (xml->name == "camera"       ) return nullptr;
    else if (xml->name == "environment"  ) return nullptr;
    else if (xml->name == "geometryGroup") return loadGroupNode(xml);
    else if (xml->name == "renderElement") return nullptr;
    else THROW_RUNTIME_ERROR(xml->loc.str()+": unknown tag: "+xml->name);
    return nullptr;
  }